

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jidctint.c
# Opt level: O2

void jpeg_idct_16x16(j_decompress_ptr cinfo,jpeg_component_info *compptr,JCOEFPTR coef_block,
                    JSAMPARRAY output_buf,JDIMENSION output_col)

{
  int iVar1;
  int iVar2;
  JSAMPLE *pJVar3;
  void *pvVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  long lVar19;
  int iVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  int iVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  int iVar29;
  int iVar30;
  long lVar31;
  int iVar32;
  int iVar33;
  long lVar34;
  long lVar35;
  int iVar36;
  int iVar37;
  long lVar38;
  long lVar39;
  int iVar40;
  long lVar41;
  int iVar42;
  long lVar43;
  long lVar44;
  long lVar45;
  int iVar46;
  int iVar47;
  int iVar48;
  long lVar49;
  long lVar50;
  int workspace [128];
  int local_238 [130];
  
  pJVar3 = cinfo->sample_range_limit;
  pvVar4 = compptr->dct_table;
  for (lVar23 = 0; (int)lVar23 != 8; lVar23 = lVar23 + 1) {
    lVar12 = (long)*(short *)((long)pvVar4 + lVar23 * 2) * (long)coef_block[lVar23] * 0x2000;
    lVar15 = (long)*(short *)((long)pvVar4 + lVar23 * 2 + 0x40) * (long)coef_block[lVar23 + 0x20];
    lVar34 = lVar15 * 0x29cf + lVar12 + 0x400;
    lVar38 = lVar12 + 0x400 + lVar15 * -0x29cf;
    lVar43 = lVar15 * 0x1151 + lVar12 + 0x400;
    lVar49 = lVar12 + 0x400 + lVar15 * -0x1151;
    lVar12 = (long)*(short *)((long)pvVar4 + lVar23 * 2 + 0x20) * (long)coef_block[lVar23 + 0x10];
    lVar15 = (long)*(short *)((long)pvVar4 + lVar23 * 2 + 0x60) * (long)coef_block[lVar23 + 0x30];
    lVar25 = (lVar12 - lVar15) * 0x8d4;
    lVar13 = (lVar12 - lVar15) * 0x2c63;
    lVar31 = lVar15 * 0x5203 + lVar13;
    lVar7 = lVar12 * 0x1ccd + lVar25;
    lVar13 = lVar12 * -0x133e + lVar13;
    lVar25 = lVar15 * -0x1050 + lVar25;
    lVar12 = lVar31 + lVar34;
    lVar34 = lVar34 - lVar31;
    lVar15 = lVar7 + lVar43;
    lVar43 = lVar43 - lVar7;
    lVar7 = lVar13 + lVar49;
    lVar49 = lVar49 - lVar13;
    lVar13 = lVar25 + lVar38;
    lVar38 = lVar38 - lVar25;
    lVar26 = (long)*(short *)((long)pvVar4 + lVar23 * 2 + 0x10) * (long)coef_block[lVar23 + 8];
    lVar25 = (long)*(short *)((long)pvVar4 + lVar23 * 2 + 0x30) * (long)coef_block[lVar23 + 0x18];
    lVar35 = (long)*(short *)((long)pvVar4 + lVar23 * 2 + 0x50) * (long)coef_block[lVar23 + 0x28];
    lVar14 = (long)*(short *)((long)pvVar4 + lVar23 * 2 + 0x70) * (long)coef_block[lVar23 + 0x38];
    lVar31 = (lVar25 + lVar26) * 0x2b4e;
    lVar21 = (lVar14 + lVar26) * 0x22fc;
    lVar39 = (lVar35 + lVar26) * 0x27e9;
    lVar50 = lVar26 * -0x492a + lVar31 + lVar39 + lVar21;
    lVar19 = (lVar26 - lVar14) * 0x1cb6;
    lVar41 = (lVar35 + lVar26) * 0x1555;
    lVar44 = (lVar26 - lVar25) * 0xd23;
    lVar22 = lVar26 * -0x3abe + lVar44 + lVar41 + lVar19;
    lVar27 = (lVar35 + lVar25) * 0x470;
    lVar26 = (lVar25 + lVar14) * -0x1555;
    lVar28 = lVar27 + lVar26 + lVar25 * 0x24d + lVar31;
    lVar45 = (lVar35 - lVar25) * 0x2d09;
    lVar31 = (lVar25 + lVar14) * -0x27e9;
    lVar44 = lVar45 + lVar31 + lVar25 * 0x3f1a + lVar44;
    lVar25 = (lVar14 + lVar35) * -0x2b4e;
    lVar27 = lVar39 + lVar25 + lVar35 * -0x2406 + lVar27;
    lVar26 = lVar21 + lVar25 + lVar14 * 0x2218 + lVar26;
    lVar25 = (lVar14 - lVar35) * 0xd23;
    lVar31 = lVar19 + lVar25 + lVar14 * 0x6485 + lVar31;
    lVar25 = lVar41 + lVar25 + lVar35 * -0x1886 + lVar45;
    local_238[lVar23] = (int)((ulong)(lVar50 + lVar12) >> 0xb);
    local_238[lVar23 + 0x78] = (int)((ulong)(lVar12 - lVar50) >> 0xb);
    local_238[lVar23 + 8] = (int)((ulong)(lVar28 + lVar15) >> 0xb);
    local_238[lVar23 + 0x70] = (int)((ulong)(lVar15 - lVar28) >> 0xb);
    local_238[lVar23 + 0x10] = (int)((ulong)(lVar27 + lVar7) >> 0xb);
    local_238[lVar23 + 0x68] = (int)((ulong)(lVar7 - lVar27) >> 0xb);
    local_238[lVar23 + 0x18] = (int)((ulong)(lVar26 + lVar13) >> 0xb);
    local_238[lVar23 + 0x60] = (int)((ulong)(lVar13 - lVar26) >> 0xb);
    local_238[lVar23 + 0x20] = (int)((ulong)(lVar38 + lVar31) >> 0xb);
    local_238[lVar23 + 0x58] = (int)((ulong)(lVar38 - lVar31) >> 0xb);
    local_238[lVar23 + 0x28] = (int)((ulong)(lVar49 + lVar25) >> 0xb);
    local_238[lVar23 + 0x50] = (int)((ulong)(lVar49 - lVar25) >> 0xb);
    local_238[lVar23 + 0x30] = (int)((ulong)(lVar44 + lVar43) >> 0xb);
    local_238[lVar23 + 0x48] = (int)((ulong)(lVar43 - lVar44) >> 0xb);
    local_238[lVar23 + 0x38] = (int)((ulong)(lVar22 + lVar34) >> 0xb);
    local_238[lVar23 + 0x40] = (int)((ulong)(lVar34 - lVar22) >> 0xb);
  }
  uVar8 = (ulong)output_col;
  for (lVar23 = 0; lVar23 != 0x80; lVar23 = lVar23 + 8) {
    iVar6 = local_238[lVar23 + 1];
    iVar32 = local_238[lVar23] * 0x2000;
    iVar1 = local_238[lVar23 + 4];
    iVar29 = iVar32 + iVar1 * 0x29cf + 0x20000;
    iVar36 = iVar32 + iVar1 * 0x1151 + 0x20000;
    iVar42 = iVar32 + 0x20000 + iVar1 * -0x29cf;
    iVar33 = iVar32 + 0x20000 + iVar1 * -0x1151;
    iVar1 = local_238[lVar23 + 2];
    iVar32 = local_238[lVar23 + 6];
    iVar24 = (iVar1 - iVar32) * 0x8d4;
    iVar9 = (iVar1 - iVar32) * 0x2c63;
    iVar16 = iVar32 * 0x5203 + iVar9;
    iVar20 = iVar1 * 0x1ccd + iVar24;
    iVar9 = iVar1 * -0x133e + iVar9;
    iVar24 = iVar32 * -0x1050 + iVar24;
    iVar1 = iVar16 + iVar29;
    iVar29 = iVar29 - iVar16;
    iVar32 = iVar20 + iVar36;
    iVar36 = iVar36 - iVar20;
    iVar16 = iVar9 + iVar33;
    iVar33 = iVar33 - iVar9;
    iVar9 = iVar24 + iVar42;
    iVar42 = iVar42 - iVar24;
    iVar24 = local_238[lVar23 + 3];
    iVar20 = local_238[lVar23 + 5];
    iVar2 = local_238[lVar23 + 7];
    iVar46 = (iVar24 + iVar6) * 0x2b4e;
    iVar10 = (iVar2 + iVar6) * 0x22fc;
    iVar40 = (iVar20 + iVar6) * 0x27e9;
    iVar17 = iVar6 * -0x492a + iVar46 + iVar10 + iVar40;
    iVar18 = (iVar6 - iVar2) * 0x1cb6;
    iVar5 = (iVar20 + iVar6) * 0x1555;
    iVar37 = (iVar6 - iVar24) * 0xd23;
    iVar11 = iVar6 * -0x3abe + iVar37 + iVar5 + iVar18;
    iVar47 = (iVar20 + iVar24) * 0x470;
    iVar6 = (iVar24 + iVar2) * -0x1555;
    iVar48 = iVar47 + iVar6 + iVar24 * 0x24d + iVar46;
    iVar30 = (iVar20 - iVar24) * 0x2d09;
    iVar46 = (iVar24 + iVar2) * -0x27e9;
    iVar37 = iVar30 + iVar46 + iVar24 * 0x3f1a + iVar37;
    iVar24 = (iVar2 + iVar20) * -0x2b4e;
    iVar40 = iVar40 + iVar24 + iVar20 * -0x2406 + iVar47;
    iVar10 = iVar10 + iVar24 + iVar2 * 0x2218 + iVar6;
    iVar6 = (iVar2 - iVar20) * 0xd23;
    iVar24 = iVar18 + iVar6 + iVar2 * 0x6485 + iVar46;
    iVar6 = iVar5 + iVar6 + iVar20 * -0x1886 + iVar30;
    lVar12 = *(long *)((long)output_buf + lVar23);
    *(JSAMPLE *)(lVar12 + uVar8) = pJVar3[(ulong)((uint)(iVar17 + iVar1) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar12 + 0xf + uVar8) =
         pJVar3[(ulong)((uint)(iVar1 - iVar17) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar12 + 1 + uVar8) =
         pJVar3[(ulong)((uint)(iVar48 + iVar32) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar12 + 0xe + uVar8) =
         pJVar3[(ulong)((uint)(iVar32 - iVar48) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar12 + 2 + uVar8) =
         pJVar3[(ulong)((uint)(iVar16 + iVar40) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar12 + 0xd + uVar8) =
         pJVar3[(ulong)((uint)(iVar16 - iVar40) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar12 + 3 + uVar8) =
         pJVar3[(ulong)((uint)(iVar10 + iVar9) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar12 + 0xc + uVar8) =
         pJVar3[(ulong)((uint)(iVar9 - iVar10) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar12 + 4 + uVar8) =
         pJVar3[(ulong)((uint)(iVar42 + iVar24) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar12 + 0xb + uVar8) =
         pJVar3[(ulong)((uint)(iVar42 - iVar24) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar12 + 5 + uVar8) =
         pJVar3[(ulong)((uint)(iVar6 + iVar33) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar12 + 10 + uVar8) =
         pJVar3[(ulong)((uint)(iVar33 - iVar6) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar12 + 6 + uVar8) =
         pJVar3[(ulong)((uint)(iVar37 + iVar36) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar12 + 9 + uVar8) =
         pJVar3[(ulong)((uint)(iVar36 - iVar37) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar12 + 7 + uVar8) =
         pJVar3[(ulong)((uint)(iVar11 + iVar29) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar12 + 8 + uVar8) =
         pJVar3[(ulong)((uint)(iVar29 - iVar11) >> 0x12 & 0x3ff) + 0x80];
  }
  return;
}

Assistant:

GLOBAL(void)
jpeg_idct_16x16(j_decompress_ptr cinfo, jpeg_component_info *compptr,
                JCOEFPTR coef_block, JSAMPARRAY output_buf,
                JDIMENSION output_col)
{
  JLONG tmp0, tmp1, tmp2, tmp3, tmp10, tmp11, tmp12, tmp13;
  JLONG tmp20, tmp21, tmp22, tmp23, tmp24, tmp25, tmp26, tmp27;
  JLONG z1, z2, z3, z4;
  JCOEFPTR inptr;
  ISLOW_MULT_TYPE *quantptr;
  int *wsptr;
  JSAMPROW outptr;
  JSAMPLE *range_limit = IDCT_range_limit(cinfo);
  int ctr;
  int workspace[8 * 16];        /* buffers data between passes */
  SHIFT_TEMPS

  /* Pass 1: process columns from input, store into work array. */

  inptr = coef_block;
  quantptr = (ISLOW_MULT_TYPE *)compptr->dct_table;
  wsptr = workspace;
  for (ctr = 0; ctr < 8; ctr++, inptr++, quantptr++, wsptr++) {
    /* Even part */

    tmp0 = DEQUANTIZE(inptr[DCTSIZE * 0], quantptr[DCTSIZE * 0]);
    tmp0 = LEFT_SHIFT(tmp0, CONST_BITS);
    /* Add fudge factor here for final descale. */
    tmp0 += ONE << (CONST_BITS - PASS1_BITS - 1);

    z1 = DEQUANTIZE(inptr[DCTSIZE * 4], quantptr[DCTSIZE * 4]);
    tmp1 = MULTIPLY(z1, FIX(1.306562965));      /* c4[16] = c2[8] */
    tmp2 = MULTIPLY(z1, FIX_0_541196100);       /* c12[16] = c6[8] */

    tmp10 = tmp0 + tmp1;
    tmp11 = tmp0 - tmp1;
    tmp12 = tmp0 + tmp2;
    tmp13 = tmp0 - tmp2;

    z1 = DEQUANTIZE(inptr[DCTSIZE * 2], quantptr[DCTSIZE * 2]);
    z2 = DEQUANTIZE(inptr[DCTSIZE * 6], quantptr[DCTSIZE * 6]);
    z3 = z1 - z2;
    z4 = MULTIPLY(z3, FIX(0.275899379));        /* c14[16] = c7[8] */
    z3 = MULTIPLY(z3, FIX(1.387039845));        /* c2[16] = c1[8] */

    tmp0 = z3 + MULTIPLY(z2, FIX_2_562915447);  /* (c6+c2)[16] = (c3+c1)[8] */
    tmp1 = z4 + MULTIPLY(z1, FIX_0_899976223);  /* (c6-c14)[16] = (c3-c7)[8] */
    tmp2 = z3 - MULTIPLY(z1, FIX(0.601344887)); /* (c2-c10)[16] = (c1-c5)[8] */
    tmp3 = z4 - MULTIPLY(z2, FIX(0.509795579)); /* (c10-c14)[16] = (c5-c7)[8] */

    tmp20 = tmp10 + tmp0;
    tmp27 = tmp10 - tmp0;
    tmp21 = tmp12 + tmp1;
    tmp26 = tmp12 - tmp1;
    tmp22 = tmp13 + tmp2;
    tmp25 = tmp13 - tmp2;
    tmp23 = tmp11 + tmp3;
    tmp24 = tmp11 - tmp3;

    /* Odd part */

    z1 = DEQUANTIZE(inptr[DCTSIZE * 1], quantptr[DCTSIZE * 1]);
    z2 = DEQUANTIZE(inptr[DCTSIZE * 3], quantptr[DCTSIZE * 3]);
    z3 = DEQUANTIZE(inptr[DCTSIZE * 5], quantptr[DCTSIZE * 5]);
    z4 = DEQUANTIZE(inptr[DCTSIZE * 7], quantptr[DCTSIZE * 7]);

    tmp11 = z1 + z3;

    tmp1  = MULTIPLY(z1 + z2, FIX(1.353318001));   /* c3 */
    tmp2  = MULTIPLY(tmp11,   FIX(1.247225013));   /* c5 */
    tmp3  = MULTIPLY(z1 + z4, FIX(1.093201867));   /* c7 */
    tmp10 = MULTIPLY(z1 - z4, FIX(0.897167586));   /* c9 */
    tmp11 = MULTIPLY(tmp11,   FIX(0.666655658));   /* c11 */
    tmp12 = MULTIPLY(z1 - z2, FIX(0.410524528));   /* c13 */
    tmp0  = tmp1 + tmp2 + tmp3 -
            MULTIPLY(z1, FIX(2.286341144));        /* c7+c5+c3-c1 */
    tmp13 = tmp10 + tmp11 + tmp12 -
            MULTIPLY(z1, FIX(1.835730603));        /* c9+c11+c13-c15 */
    z1    = MULTIPLY(z2 + z3, FIX(0.138617169));   /* c15 */
    tmp1  += z1 + MULTIPLY(z2, FIX(0.071888074));  /* c9+c11-c3-c15 */
    tmp2  += z1 - MULTIPLY(z3, FIX(1.125726048));  /* c5+c7+c15-c3 */
    z1    = MULTIPLY(z3 - z2, FIX(1.407403738));   /* c1 */
    tmp11 += z1 - MULTIPLY(z3, FIX(0.766367282));  /* c1+c11-c9-c13 */
    tmp12 += z1 + MULTIPLY(z2, FIX(1.971951411));  /* c1+c5+c13-c7 */
    z2    += z4;
    z1    = MULTIPLY(z2, -FIX(0.666655658));       /* -c11 */
    tmp1  += z1;
    tmp3  += z1 + MULTIPLY(z4, FIX(1.065388962));  /* c3+c11+c15-c7 */
    z2    = MULTIPLY(z2, -FIX(1.247225013));       /* -c5 */
    tmp10 += z2 + MULTIPLY(z4, FIX(3.141271809));  /* c1+c5+c9-c13 */
    tmp12 += z2;
    z2    = MULTIPLY(z3 + z4, -FIX(1.353318001));  /* -c3 */
    tmp2  += z2;
    tmp3  += z2;
    z2    = MULTIPLY(z4 - z3, FIX(0.410524528));   /* c13 */
    tmp10 += z2;
    tmp11 += z2;

    /* Final output stage */

    wsptr[8 * 0]  = (int)RIGHT_SHIFT(tmp20 + tmp0,  CONST_BITS - PASS1_BITS);
    wsptr[8 * 15] = (int)RIGHT_SHIFT(tmp20 - tmp0,  CONST_BITS - PASS1_BITS);
    wsptr[8 * 1]  = (int)RIGHT_SHIFT(tmp21 + tmp1,  CONST_BITS - PASS1_BITS);
    wsptr[8 * 14] = (int)RIGHT_SHIFT(tmp21 - tmp1,  CONST_BITS - PASS1_BITS);
    wsptr[8 * 2]  = (int)RIGHT_SHIFT(tmp22 + tmp2,  CONST_BITS - PASS1_BITS);
    wsptr[8 * 13] = (int)RIGHT_SHIFT(tmp22 - tmp2,  CONST_BITS - PASS1_BITS);
    wsptr[8 * 3]  = (int)RIGHT_SHIFT(tmp23 + tmp3,  CONST_BITS - PASS1_BITS);
    wsptr[8 * 12] = (int)RIGHT_SHIFT(tmp23 - tmp3,  CONST_BITS - PASS1_BITS);
    wsptr[8 * 4]  = (int)RIGHT_SHIFT(tmp24 + tmp10, CONST_BITS - PASS1_BITS);
    wsptr[8 * 11] = (int)RIGHT_SHIFT(tmp24 - tmp10, CONST_BITS - PASS1_BITS);
    wsptr[8 * 5]  = (int)RIGHT_SHIFT(tmp25 + tmp11, CONST_BITS - PASS1_BITS);
    wsptr[8 * 10] = (int)RIGHT_SHIFT(tmp25 - tmp11, CONST_BITS - PASS1_BITS);
    wsptr[8 * 6]  = (int)RIGHT_SHIFT(tmp26 + tmp12, CONST_BITS - PASS1_BITS);
    wsptr[8 * 9]  = (int)RIGHT_SHIFT(tmp26 - tmp12, CONST_BITS - PASS1_BITS);
    wsptr[8 * 7]  = (int)RIGHT_SHIFT(tmp27 + tmp13, CONST_BITS - PASS1_BITS);
    wsptr[8 * 8]  = (int)RIGHT_SHIFT(tmp27 - tmp13, CONST_BITS - PASS1_BITS);
  }

  /* Pass 2: process 16 rows from work array, store into output array. */

  wsptr = workspace;
  for (ctr = 0; ctr < 16; ctr++) {
    outptr = output_buf[ctr] + output_col;

    /* Even part */

    /* Add fudge factor here for final descale. */
    tmp0 = (JLONG)wsptr[0] + (ONE << (PASS1_BITS + 2));
    tmp0 = LEFT_SHIFT(tmp0, CONST_BITS);

    z1 = (JLONG)wsptr[4];
    tmp1 = MULTIPLY(z1, FIX(1.306562965));      /* c4[16] = c2[8] */
    tmp2 = MULTIPLY(z1, FIX_0_541196100);       /* c12[16] = c6[8] */

    tmp10 = tmp0 + tmp1;
    tmp11 = tmp0 - tmp1;
    tmp12 = tmp0 + tmp2;
    tmp13 = tmp0 - tmp2;

    z1 = (JLONG)wsptr[2];
    z2 = (JLONG)wsptr[6];
    z3 = z1 - z2;
    z4 = MULTIPLY(z3, FIX(0.275899379));        /* c14[16] = c7[8] */
    z3 = MULTIPLY(z3, FIX(1.387039845));        /* c2[16] = c1[8] */

    tmp0 = z3 + MULTIPLY(z2, FIX_2_562915447);  /* (c6+c2)[16] = (c3+c1)[8] */
    tmp1 = z4 + MULTIPLY(z1, FIX_0_899976223);  /* (c6-c14)[16] = (c3-c7)[8] */
    tmp2 = z3 - MULTIPLY(z1, FIX(0.601344887)); /* (c2-c10)[16] = (c1-c5)[8] */
    tmp3 = z4 - MULTIPLY(z2, FIX(0.509795579)); /* (c10-c14)[16] = (c5-c7)[8] */

    tmp20 = tmp10 + tmp0;
    tmp27 = tmp10 - tmp0;
    tmp21 = tmp12 + tmp1;
    tmp26 = tmp12 - tmp1;
    tmp22 = tmp13 + tmp2;
    tmp25 = tmp13 - tmp2;
    tmp23 = tmp11 + tmp3;
    tmp24 = tmp11 - tmp3;

    /* Odd part */

    z1 = (JLONG)wsptr[1];
    z2 = (JLONG)wsptr[3];
    z3 = (JLONG)wsptr[5];
    z4 = (JLONG)wsptr[7];

    tmp11 = z1 + z3;

    tmp1  = MULTIPLY(z1 + z2, FIX(1.353318001));   /* c3 */
    tmp2  = MULTIPLY(tmp11,   FIX(1.247225013));   /* c5 */
    tmp3  = MULTIPLY(z1 + z4, FIX(1.093201867));   /* c7 */
    tmp10 = MULTIPLY(z1 - z4, FIX(0.897167586));   /* c9 */
    tmp11 = MULTIPLY(tmp11,   FIX(0.666655658));   /* c11 */
    tmp12 = MULTIPLY(z1 - z2, FIX(0.410524528));   /* c13 */
    tmp0  = tmp1 + tmp2 + tmp3 -
            MULTIPLY(z1, FIX(2.286341144));        /* c7+c5+c3-c1 */
    tmp13 = tmp10 + tmp11 + tmp12 -
            MULTIPLY(z1, FIX(1.835730603));        /* c9+c11+c13-c15 */
    z1    = MULTIPLY(z2 + z3, FIX(0.138617169));   /* c15 */
    tmp1  += z1 + MULTIPLY(z2, FIX(0.071888074));  /* c9+c11-c3-c15 */
    tmp2  += z1 - MULTIPLY(z3, FIX(1.125726048));  /* c5+c7+c15-c3 */
    z1    = MULTIPLY(z3 - z2, FIX(1.407403738));   /* c1 */
    tmp11 += z1 - MULTIPLY(z3, FIX(0.766367282));  /* c1+c11-c9-c13 */
    tmp12 += z1 + MULTIPLY(z2, FIX(1.971951411));  /* c1+c5+c13-c7 */
    z2    += z4;
    z1    = MULTIPLY(z2, -FIX(0.666655658));       /* -c11 */
    tmp1  += z1;
    tmp3  += z1 + MULTIPLY(z4, FIX(1.065388962));  /* c3+c11+c15-c7 */
    z2    = MULTIPLY(z2, -FIX(1.247225013));       /* -c5 */
    tmp10 += z2 + MULTIPLY(z4, FIX(3.141271809));  /* c1+c5+c9-c13 */
    tmp12 += z2;
    z2    = MULTIPLY(z3 + z4, -FIX(1.353318001));  /* -c3 */
    tmp2  += z2;
    tmp3  += z2;
    z2    = MULTIPLY(z4 - z3, FIX(0.410524528));   /* c13 */
    tmp10 += z2;
    tmp11 += z2;

    /* Final output stage */

    outptr[0]  = range_limit[(int)RIGHT_SHIFT(tmp20 + tmp0,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[15] = range_limit[(int)RIGHT_SHIFT(tmp20 - tmp0,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[1]  = range_limit[(int)RIGHT_SHIFT(tmp21 + tmp1,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[14] = range_limit[(int)RIGHT_SHIFT(tmp21 - tmp1,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[2]  = range_limit[(int)RIGHT_SHIFT(tmp22 + tmp2,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[13] = range_limit[(int)RIGHT_SHIFT(tmp22 - tmp2,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[3]  = range_limit[(int)RIGHT_SHIFT(tmp23 + tmp3,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[12] = range_limit[(int)RIGHT_SHIFT(tmp23 - tmp3,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[4]  = range_limit[(int)RIGHT_SHIFT(tmp24 + tmp10,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[11] = range_limit[(int)RIGHT_SHIFT(tmp24 - tmp10,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[5]  = range_limit[(int)RIGHT_SHIFT(tmp25 + tmp11,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[10] = range_limit[(int)RIGHT_SHIFT(tmp25 - tmp11,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[6]  = range_limit[(int)RIGHT_SHIFT(tmp26 + tmp12,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[9]  = range_limit[(int)RIGHT_SHIFT(tmp26 - tmp12,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[7]  = range_limit[(int)RIGHT_SHIFT(tmp27 + tmp13,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[8]  = range_limit[(int)RIGHT_SHIFT(tmp27 - tmp13,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];

    wsptr += 8;         /* advance pointer to next row */
  }
}